

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluCheckDecInAny(word t,int nVars)

{
  word wVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  word wVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar;
  int iVar_00;
  
  iVar7 = 0;
  if (0 < nVars) {
    iVar7 = nVars;
  }
  iVar = 0;
  do {
    if (iVar == iVar7) {
      return 0;
    }
    wVar1 = Abc_Tt6Cofactor0(t,iVar);
    wVar2 = Abc_Tt6Cofactor1(t,iVar);
    iVar = iVar + 1;
    iVar_00 = iVar;
    while (iVar_00 < nVars) {
      wVar3 = Abc_Tt6Cofactor0((long)(int)wVar1,iVar_00);
      wVar4 = Abc_Tt6Cofactor1((long)(int)wVar1,iVar_00);
      wVar5 = Abc_Tt6Cofactor0((long)(int)wVar2,iVar_00);
      wVar6 = Abc_Tt6Cofactor1((long)(int)wVar2,iVar_00);
      iVar8 = (int)wVar3;
      iVar10 = (int)wVar4;
      iVar9 = (int)wVar5;
      if ((((iVar8 == iVar10) && (iVar8 == iVar9)) ||
          ((iVar8 == iVar10 || iVar8 == iVar9 && (iVar8 == (int)wVar6)))) ||
         ((iVar_00 = iVar_00 + 1, iVar10 == iVar9 && (iVar10 == (int)wVar6)))) {
        return 1;
      }
    }
  } while( true );
}

Assistant:

int If_CluCheckDecInAny( word t, int nVars )
{
    int v, u, Cof2[2], Cof4[4];
    for ( v = 0; v < nVars; v++ )
    {
        Cof2[0] = Abc_Tt6Cofactor0( t, v );
        Cof2[1] = Abc_Tt6Cofactor1( t, v );
        for ( u = v+1; u < nVars; u++ )
        {
            Cof4[0] = Abc_Tt6Cofactor0( Cof2[0], u );
            Cof4[1] = Abc_Tt6Cofactor1( Cof2[0], u );
            Cof4[2] = Abc_Tt6Cofactor0( Cof2[1], u );
            Cof4[3] = Abc_Tt6Cofactor1( Cof2[1], u );
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[2] )
                return 1;
            if ( Cof4[0] == Cof4[2] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[0] == Cof4[1] && Cof4[0] == Cof4[3] )
                return 1;
            if ( Cof4[1] == Cof4[2] && Cof4[1] == Cof4[3] )
                return 1;
        }
    }
    return 0;
}